

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O1

void duckdb_brotli::BrotliCreateHqZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
               Hasher *hasher,int *dist_cache,size_t *last_insert_len,Command *commands,
               size_t *num_commands,size_t *num_literals)

{
  anon_union_7040_2_2186ba77_for_ZopfliCostModel_6 *histogram;
  uint32_t *histogram_00;
  BackwardMatch *src2;
  ulong *puVar1;
  int *piVar2;
  float *pfVar3;
  uint32_t *puVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  size_t sVar8;
  size_t gap;
  BrotliEncoderDictionary *dictionary;
  uint32_t *puVar9;
  size_t sVar10;
  PreparedDictionary *pPVar11;
  ulong uVar12;
  float *pfVar13;
  ulong uVar14;
  byte bVar15;
  BrotliEncoderParams *pBVar16;
  anon_union_4_3_cc401a1e_for_u *paVar17;
  byte bVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint8_t *s1_orig_1;
  ZopfliCostModel *self;
  ulong uVar22;
  ulong uVar23;
  void *pvVar24;
  ulong uVar25;
  long lVar26;
  BackwardMatch *src1;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ZopfliNode *nodes;
  float *cost;
  ulong uVar30;
  size_t sVar31;
  ulong uVar32;
  size_t sVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  undefined8 *puVar37;
  size_t sVar38;
  ulong uVar39;
  size_t sVar40;
  ulong uVar41;
  long lVar42;
  Hasher *pHVar43;
  BrotliEncoderParams *pBVar44;
  ulong uVar45;
  ulong uVar46;
  ulong *puVar47;
  long lVar48;
  ulong *puVar49;
  BrotliEncoderParams *pBVar50;
  ulong uVar51;
  long lVar52;
  uint8_t *s1_orig_2;
  ulong *puVar53;
  uint *puVar54;
  size_t sVar55;
  ulong *puVar56;
  BrotliEncoderParams *pBVar57;
  uint8_t *s1_orig_3;
  long lVar58;
  BrotliEncoderParams *max_length;
  bool bVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  undefined1 auVar64 [16];
  long local_260;
  ulong local_258;
  ulong local_250;
  ulong local_248;
  void *local_240;
  BrotliEncoderParams *local_238;
  BackwardMatch *local_230;
  size_t total_found;
  BrotliEncoderParams *local_210;
  BrotliEncoderParams *local_208;
  void *local_1d8;
  long local_1d0;
  ulong local_1b0;
  int orig_dist_cache [4];
  uint32_t dict_matches [38];
  
  sVar8 = params->stream_offset;
  iVar20 = params->lgwin;
  if (num_bytes == 0) {
    local_1d8 = (void *)0x0;
  }
  else {
    local_1d8 = BrotliAllocate(m,num_bytes * 4);
  }
  local_1b0 = num_bytes * 4;
  local_240 = (void *)0x0;
  lVar58 = num_bytes - 0x7f;
  if (num_bytes < 0x7f) {
    lVar58 = 0;
  }
  self = (ZopfliCostModel *)BrotliAllocate(m,0x26a8);
  if (local_1b0 != 0) {
    local_240 = BrotliAllocate(m,num_bytes << 5);
  }
  gap = (params->dictionary).compound.total_size;
  if (3 < num_bytes) {
    uVar30 = (1L << ((byte)iVar20 & 0x3f)) - 0x10;
    uVar32 = (ulong)((params->dictionary).compound.num_chunks != 0) * 0x100;
    local_1d0 = 0;
    lVar29 = 0;
    auVar64 = _DAT_01352200;
    do {
      uVar35 = lVar29 + position;
      uVar39 = uVar30;
      if (uVar35 < uVar30) {
        uVar39 = uVar35;
      }
      uVar22 = sVar8 + uVar35;
      if (uVar30 <= uVar22) {
        uVar22 = uVar30;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        uVar25 = 0;
      }
      else {
        if (uVar35 == 0) {
          uVar25 = 0;
        }
        else {
          uVar25 = (ulong)ringbuffer[uVar35 - 1 & ringbuffer_mask];
        }
        if (uVar35 < 2) {
          uVar23 = 0;
        }
        else {
          uVar23 = (ulong)ringbuffer[uVar35 - 2 & ringbuffer_mask];
        }
        uVar25 = (ulong)(params->dictionary).contextual.context_map
                        [literal_context_lut[uVar23 + 0x100] | literal_context_lut[uVar25]];
      }
      uVar23 = (uVar32 | 0x80) + local_1d0;
      if (local_1b0 < uVar23) {
        uVar45 = local_1b0;
        if (local_1b0 == 0) {
          uVar45 = uVar23;
        }
        do {
          uVar41 = uVar45;
          uVar45 = uVar41 * 2;
        } while (uVar41 < uVar23);
        if (uVar41 == 0) {
          pvVar24 = (void *)0x0;
        }
        else {
          pvVar24 = BrotliAllocate(m,uVar41 * 8);
        }
        if (local_1b0 != 0) {
          switchD_00b1422a::default(pvVar24,local_240,local_1b0 << 3);
        }
        BrotliFree(m,local_240);
        local_240 = pvVar24;
        auVar64 = _DAT_01352200;
        local_1b0 = uVar41;
      }
      max_length = (BrotliEncoderParams *)(num_bytes - lVar29);
      dictionary = (params->dictionary).contextual.dict[uVar25];
      lVar36 = local_1d0 + uVar32;
      src2 = (BackwardMatch *)((long)local_240 + lVar36 * 8);
      uVar23 = uVar35 & ringbuffer_mask;
      uVar25 = 0x10;
      if (params->quality == 0xb) {
        uVar25 = 0x40;
      }
      uVar45 = 0;
      if (uVar25 <= uVar35) {
        uVar45 = uVar35 - uVar25;
      }
      puVar1 = (ulong *)(ringbuffer + uVar23);
      pBVar44 = (BrotliEncoderParams *)&DAT_00000001;
      uVar25 = uVar35;
      pBVar50 = params;
      total_found = (size_t)src2;
      do {
        uVar25 = uVar25 - 1;
        if ((uVar25 <= uVar45) || ((BrotliEncoderParams *)0x2 < pBVar44)) break;
        uVar41 = uVar35 - uVar25;
        if ((uVar41 <= uVar39) &&
           (((uint8_t)*puVar1 == ringbuffer[uVar25 & ringbuffer_mask] &&
            (puVar47 = (ulong *)(ringbuffer + (uVar25 & ringbuffer_mask)), pBVar57 = max_length,
            puVar53 = puVar1, puVar49 = puVar47,
            *(char *)((long)puVar1 + 1) == *(char *)((long)puVar47 + 1))))) {
          for (; (BrotliEncoderParams *)0x7 < pBVar57;
              pBVar57 = (BrotliEncoderParams *)&pBVar57[-1].dictionary.max_quality) {
            uVar27 = *puVar53;
            uVar28 = *puVar49;
            if (uVar27 == uVar28) {
              puVar49 = puVar49 + 1;
            }
            else {
              uVar51 = 0;
              if ((uVar28 ^ uVar27) != 0) {
                for (; ((uVar28 ^ uVar27) >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                }
              }
              pBVar50 = (BrotliEncoderParams *)
                        ((long)puVar49 + ((uVar51 >> 3 & 0x1fffffff) - (long)puVar47));
            }
            if (uVar27 != uVar28) goto LAB_01158108;
            puVar53 = puVar53 + 1;
          }
          if (pBVar57 != (BrotliEncoderParams *)0x0) {
            pBVar50 = (BrotliEncoderParams *)0x0;
            do {
              pBVar16 = pBVar50;
              if (*(char *)((long)puVar49 + (long)pBVar50) !=
                  *(char *)((long)puVar53 + (long)pBVar50)) break;
              pBVar50 = (BrotliEncoderParams *)((long)&pBVar50->mode + 1);
              pBVar16 = pBVar57;
            } while (pBVar57 != pBVar50);
            puVar49 = (ulong *)((long)puVar49 + (long)pBVar16);
          }
          pBVar50 = (BrotliEncoderParams *)((long)puVar49 - (long)puVar47);
LAB_01158108:
          if (pBVar44 < pBVar50) {
            *(int *)total_found = (int)uVar41;
            *(int *)(total_found + 4) = (int)pBVar50 << 5;
            total_found = total_found + 8;
            pBVar44 = pBVar50;
          }
        }
        pBVar50 = pBVar44;
      } while (uVar41 <= uVar39);
      if (pBVar44 < max_length) {
        uVar19 = (uint)(*(int *)(ringbuffer + uVar23) * 0x1e35a7bd) >> 0xf;
        uVar25 = (hasher->privat)._H5.bucket_size_;
        puVar9 = (hasher->privat)._H2.buckets_;
        pvVar24 = (hasher->privat)._H40.extra[1];
        uVar45 = (ulong)puVar9[uVar19];
        pBVar50 = max_length;
        if ((BrotliEncoderParams *)0x7f < max_length) {
          puVar9[uVar19] = (uint32_t)uVar35;
          pBVar50 = (BrotliEncoderParams *)0x80;
        }
        lVar26 = (uVar25 & uVar35) * 2 + 1;
        lVar42 = (uVar25 & uVar35) * 2;
        lVar52 = 0x40;
        local_238 = (BrotliEncoderParams *)0x0;
        local_208 = (BrotliEncoderParams *)0x0;
        do {
          uVar41 = uVar35 - uVar45;
          if ((uVar41 == 0) || (lVar52 == 0 || uVar39 < uVar41)) {
            if ((BrotliEncoderParams *)0x7f < max_length) {
              *(int *)((long)pvVar24 + lVar42 * 4) = (hasher->privat)._H5.hash_shift_;
              iVar20 = (hasher->privat)._H5.hash_shift_;
LAB_01158200:
              *(int *)((long)pvVar24 + lVar26 * 4) = iVar20;
            }
            bVar59 = false;
          }
          else {
            pBVar57 = local_208;
            if (local_238 < local_208) {
              pBVar57 = local_238;
            }
            puVar1 = (ulong *)(ringbuffer + uVar23 + (long)pBVar57);
            puVar53 = (ulong *)(ringbuffer + (uVar45 & ringbuffer_mask) + (long)pBVar57);
            puVar49 = puVar1;
            lVar48 = lVar26;
            for (uVar27 = (long)max_length - (long)pBVar57; 7 < uVar27; uVar27 = uVar27 - 8) {
              uVar28 = *puVar53;
              uVar51 = *puVar49;
              if (uVar28 == uVar51) {
                puVar49 = puVar49 + 1;
              }
              else {
                uVar46 = 0;
                if ((uVar51 ^ uVar28) != 0) {
                  for (; ((uVar51 ^ uVar28) >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                  }
                }
                lVar48 = (long)puVar49 + ((uVar46 >> 3 & 0x1fffffff) - (long)puVar1);
              }
              if (uVar28 != uVar51) goto LAB_011582df;
              puVar53 = puVar53 + 1;
            }
            puVar47 = puVar49;
            if (uVar27 != 0) {
              puVar47 = (ulong *)((long)puVar49 + uVar27);
              uVar28 = 0;
              do {
                if (*(char *)((long)puVar49 + uVar28) != *(char *)((long)puVar53 + uVar28)) {
                  puVar47 = (ulong *)((long)puVar49 + uVar28);
                  break;
                }
                uVar28 = uVar28 + 1;
              } while (uVar27 != uVar28);
            }
            lVar48 = (long)puVar47 - (long)puVar1;
LAB_011582df:
            pBVar57 = (BrotliEncoderParams *)
                      ((long)(pBVar57->dictionary).compound.chunks + lVar48 + -0x68);
            if ((undefined4 *)total_found == (undefined4 *)0x0) {
              total_found = 0;
            }
            else if (pBVar44 < pBVar57) {
              *(int *)total_found = (int)uVar41;
              *(int *)(total_found + 4) = (int)pBVar57 << 5;
              total_found = total_found + 8;
              pBVar44 = pBVar57;
            }
            if (pBVar57 < pBVar50) {
              if ((ringbuffer + (uVar45 & ringbuffer_mask))[(long)pBVar57] <
                  (ringbuffer + uVar23)[(long)pBVar57]) {
                if ((BrotliEncoderParams *)0x7f < max_length) {
                  *(int *)((long)pvVar24 + lVar42 * 4) = (int)uVar45;
                }
                lVar42 = (uVar45 & uVar25) * 2 + 1;
                lVar48 = lVar42;
                local_238 = pBVar57;
              }
              else {
                if ((BrotliEncoderParams *)0x7f < max_length) {
                  *(int *)((long)pvVar24 + lVar26 * 4) = (int)uVar45;
                }
                lVar26 = (uVar45 & uVar25) * 2;
                lVar48 = lVar26;
                local_208 = pBVar57;
              }
              uVar45 = (ulong)*(uint *)((long)pvVar24 + lVar48 * 4);
              bVar59 = true;
            }
            else {
              if ((BrotliEncoderParams *)0x7f < max_length) {
                *(undefined4 *)((long)pvVar24 + lVar42 * 4) =
                     *(undefined4 *)((long)pvVar24 + (uVar45 & uVar25) * 8);
                iVar20 = *(int *)((long)pvVar24 + (uVar45 & uVar25) * 8 + 4);
                goto LAB_01158200;
              }
              bVar59 = false;
            }
          }
          lVar52 = lVar52 + -1;
        } while (bVar59);
      }
      lVar26 = 3;
      auVar61 = _DAT_0135a310;
      auVar62 = _DAT_0135a330;
      do {
        if (SUB164(auVar61 ^ auVar64,4) == -0x80000000 && SUB164(auVar61 ^ auVar64,0) < -0x7fffffda)
        {
          orig_dist_cache[lVar26 + 1] = 0xfffffff;
          orig_dist_cache[lVar26 + 2] = 0xfffffff;
        }
        if (SUB164(auVar62 ^ auVar64,4) == -0x80000000 && SUB164(auVar62 ^ auVar64,0) < -0x7fffffda)
        {
          orig_dist_cache[lVar26 + 3] = 0xfffffff;
          dict_matches[lVar26] = 0xfffffff;
        }
        lVar42 = auVar61._8_8_;
        auVar61._0_8_ = auVar61._0_8_ + 4;
        auVar61._8_8_ = lVar42 + 4;
        lVar42 = auVar62._8_8_;
        auVar62._0_8_ = auVar62._0_8_ + 4;
        auVar62._8_8_ = lVar42 + 4;
        lVar26 = lVar26 + 4;
      } while (lVar26 != 0x2b);
      pBVar50 = (BrotliEncoderParams *)((long)&pBVar44->mode + 1);
      if (pBVar50 < (BrotliEncoderParams *)0x5) {
        pBVar50 = (BrotliEncoderParams *)0x4;
      }
      puVar1 = (ulong *)(ringbuffer + uVar23);
      iVar20 = BrotliFindAllStaticDictionaryMatches
                         (dictionary,(uint8_t *)puVar1,(size_t)pBVar50,(size_t)max_length,
                          dict_matches);
      auVar64 = _DAT_01352200;
      if (iVar20 != 0) {
        pBVar44 = (BrotliEncoderParams *)0x25;
        if (max_length < (BrotliEncoderParams *)0x25) {
          pBVar44 = max_length;
        }
        if (pBVar50 <= pBVar44) {
          iVar20 = (int)pBVar50 << 5;
          do {
            uVar19 = dict_matches[(long)pBVar50];
            if ((uVar19 < 0xfffffff) &&
               (uVar39 = (ulong)(uVar19 >> 5) + gap + 1 + uVar22,
               uVar39 <= (params->dist).max_distance)) {
              uVar19 = uVar19 & 0x1f;
              *(int *)total_found = (int)uVar39;
              if (pBVar50 == (BrotliEncoderParams *)(ulong)uVar19) {
                uVar19 = 0;
              }
              *(uint *)(total_found + 4) = uVar19 + iVar20;
              total_found = total_found + 8;
            }
            pBVar50 = (BrotliEncoderParams *)((long)&pBVar50->mode + 1);
            iVar20 = iVar20 + 0x20;
          } while ((BrotliEncoderParams *)((long)&pBVar44->mode + 1) != pBVar50);
        }
      }
      sVar40 = (long)(total_found - (long)src2) >> 3;
      sVar10 = (params->dictionary).compound.num_chunks;
      if (sVar10 != 0) {
        uVar39 = (params->dist).max_distance;
        src1 = (BackwardMatch *)((long)local_240 + lVar36 * 8 + -0x200);
        sVar33 = (params->dictionary).compound.total_size;
        uVar25 = *puVar1;
        local_210 = (BrotliEncoderParams *)0x3;
        sVar38 = 0;
        sVar55 = 0;
        do {
          pPVar11 = (params->dictionary).compound.chunks[sVar55];
          bVar5 = (byte)pPVar11->bucket_bits;
          bVar18 = (byte)pPVar11->slot_bits;
          bVar15 = -(char)pPVar11->hash_bits;
          uVar45 = ((uVar25 << (bVar15 & 0x3f)) >> (bVar15 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                   (-bVar5 & 0x3f);
          lVar26 = (1L << (bVar18 & 0x3f)) * 4;
          lVar42 = (1L << (bVar5 & 0x3f)) * 2;
          bVar18 = -bVar18;
          uVar19 = (uint)*(ushort *)((long)&pPVar11[1].magic + (uVar45 & 0xffffffff) * 2 + lVar26);
          puVar37 = (undefined8 *)
                    ((long)&pPVar11[1].magic + (ulong)pPVar11->num_items * 4 + lVar42 + lVar26);
          if (pPVar11->magic != 0xdebcede0) {
            puVar37 = (undefined8 *)*puVar37;
          }
          sVar31 = (params->dictionary).compound.chunk_offsets[sVar55];
          local_230 = src1 + sVar38;
          uVar21 = pPVar11->source_size;
          puVar54 = (uint *)((long)&pPVar11[1].magic +
                            (ulong)(uVar19 + (&pPVar11[1].magic)
                                             [(uint)((int)uVar45 << (bVar18 & 0x1f)) >>
                                              (bVar18 & 0x1f)]) * 4 + lVar42 + lVar26);
          uVar19 = (uint)(uVar19 == 0xffff);
          local_260 = 0;
          pBVar50 = local_210;
          do {
            if (uVar19 != 0) break;
            uVar19 = *puVar54;
            uVar45 = (ulong)(uVar19 & 0x7fffffff);
            uVar41 = ((uVar22 + sVar33) - sVar31) - uVar45;
            pBVar44 = (BrotliEncoderParams *)(uVar21 - uVar45);
            if (max_length <= pBVar44) {
              pBVar44 = max_length;
            }
            if (uVar39 < uVar41) {
              bVar59 = false;
            }
            else {
              uVar27 = (long)(pBVar50->dictionary).compound.chunks + (uVar23 - 0x68);
              bVar59 = false;
              if ((uVar27 <= ringbuffer_mask) && (pBVar50 < pBVar44)) {
                pBVar57 = (BrotliEncoderParams *)
                          ((long)(pBVar50->dictionary).compound.chunks + (uVar45 - 0x68));
                if (ringbuffer[uVar27] == *(uint8_t *)((long)puVar37 + (long)pBVar57)) {
                  puVar47 = (ulong *)(uVar45 + (long)puVar37);
                  puVar53 = puVar1;
                  puVar49 = puVar47;
                  for (; (BrotliEncoderParams *)0x7 < pBVar44;
                      pBVar44 = (BrotliEncoderParams *)&pBVar44[-1].dictionary.max_quality) {
                    uVar45 = *puVar53;
                    uVar27 = *puVar49;
                    if (uVar45 == uVar27) {
                      puVar49 = puVar49 + 1;
                    }
                    else {
                      uVar28 = 0;
                      if ((uVar27 ^ uVar45) != 0) {
                        for (; ((uVar27 ^ uVar45) >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                        }
                      }
                      pBVar57 = (BrotliEncoderParams *)
                                ((long)puVar49 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar47));
                    }
                    if (uVar45 != uVar27) goto LAB_011587fd;
                    puVar53 = puVar53 + 1;
                  }
                  puVar56 = puVar49;
                  if (pBVar44 != (BrotliEncoderParams *)0x0) {
                    puVar56 = (ulong *)((long)puVar49 + (long)pBVar44);
                    pBVar57 = (BrotliEncoderParams *)0x0;
                    do {
                      if (*(uint8_t *)((long)puVar49 + (long)pBVar57) !=
                          *(uint8_t *)((long)puVar53 + (long)pBVar57)) {
                        puVar56 = (ulong *)((long)puVar49 + (long)pBVar57);
                        break;
                      }
                      pBVar57 = (BrotliEncoderParams *)((long)&pBVar57->mode + 1);
                    } while (pBVar44 != pBVar57);
                  }
                  pBVar57 = (BrotliEncoderParams *)((long)puVar56 - (long)puVar47);
LAB_011587fd:
                  if (pBVar50 < pBVar57) {
                    local_230->distance = (uint32_t)uVar41;
                    local_230->length_and_code = (int)pBVar57 << 5;
                    local_230 = local_230 + 1;
                    local_260 = local_260 + 1;
                    bVar59 = local_260 == 0x40 - sVar38;
                    pBVar50 = pBVar57;
                    goto LAB_0115884b;
                  }
                }
                bVar59 = false;
              }
            }
LAB_0115884b:
            puVar54 = puVar54 + 1;
            uVar19 = uVar19 & 0x80000000;
          } while (!bVar59);
          sVar38 = sVar38 + local_260;
          if (sVar38 != 0) {
            if (sVar38 == 0x40) break;
            local_210 = (BrotliEncoderParams *)
                        (ulong)(*(uint *)((long)local_240 + sVar38 * 8 + lVar36 * 8 + -0x204) >> 5);
          }
          sVar55 = sVar55 + 1;
        } while (sVar55 != sVar10);
        MergeMatches((BackwardMatch *)((long)local_240 + local_1d0 * 8),src1,sVar38,src2,sVar40);
        sVar40 = sVar40 + sVar38;
        auVar64 = _DAT_01352200;
      }
      *(int *)((long)local_1d8 + lVar29 * 4) = (int)sVar40;
      lVar36 = local_1d0;
      if (sVar40 != 0) {
        lVar36 = sVar40 + local_1d0;
        uVar19 = *(uint *)((long)local_240 + lVar36 * 8 + -4);
        if (0x28bf < uVar19) {
          uVar25 = (ulong)(uVar19 >> 5);
          uVar39 = uVar35 + 1;
          uVar22 = uVar35 + uVar25;
          if (lVar58 + position <= uVar35 + uVar25) {
            uVar22 = lVar58 + position;
          }
          uVar23 = uVar22 - 0x3f;
          if (uVar22 < uVar35 + 0x40) {
            uVar23 = uVar39;
          }
          *(undefined8 *)((long)local_240 + local_1d0 * 8) =
               *(undefined8 *)((long)local_240 + lVar36 * 8 + -8);
          *(undefined4 *)((long)local_1d8 + lVar29 * 4) = 1;
          if ((uVar35 + 0x201 <= uVar23) && (uVar39 < uVar23)) {
            uVar35 = (hasher->privat)._H5.bucket_size_;
            puVar9 = (hasher->privat)._H2.buckets_;
            pvVar24 = (hasher->privat)._H40.extra[1];
            do {
              uVar27 = uVar39 & ringbuffer_mask;
              uVar19 = (uint)(*(int *)(ringbuffer + uVar27) * 0x1e35a7bd) >> 0xf;
              uVar28 = (ulong)puVar9[uVar19];
              uVar45 = (uVar35 & uVar39) * 2 + 1;
              uVar41 = (uVar35 & uVar39) * 2;
              puVar9[uVar19] = (uint32_t)uVar39;
              lVar36 = 0x40;
              local_248 = 0;
              local_258 = 0;
              do {
                if ((uVar39 == uVar28) || (lVar36 == 0 || uVar35 - 0xf < uVar39 - uVar28)) {
                  iVar20 = (hasher->privat)._H5.hash_shift_;
                  *(int *)((long)pvVar24 + uVar41 * 4) = iVar20;
                  *(int *)((long)pvVar24 + uVar45 * 4) = iVar20;
                  bVar59 = false;
                }
                else {
                  uVar51 = local_258;
                  if (local_248 < local_258) {
                    uVar51 = local_248;
                  }
                  puVar1 = (ulong *)(ringbuffer + uVar51 + uVar27);
                  puVar53 = (ulong *)(ringbuffer + uVar51 + (uVar28 & ringbuffer_mask));
                  puVar49 = puVar1;
                  pHVar43 = hasher;
                  for (uVar46 = 0x80 - uVar51; 7 < uVar46; uVar46 = uVar46 - 8) {
                    uVar34 = *puVar53;
                    uVar12 = *puVar49;
                    if (uVar34 == uVar12) {
                      puVar49 = puVar49 + 1;
                    }
                    else {
                      uVar14 = 0;
                      if ((uVar12 ^ uVar34) != 0) {
                        for (; ((uVar12 ^ uVar34) >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                        }
                      }
                      pHVar43 = (Hasher *)
                                ((long)puVar49 + ((uVar14 >> 3 & 0x1fffffff) - (long)puVar1));
                    }
                    if (uVar34 != uVar12) goto LAB_01158b0e;
                    puVar53 = puVar53 + 1;
                  }
                  puVar47 = puVar49;
                  if (uVar46 != 0) {
                    puVar47 = (ulong *)((long)puVar49 + uVar46);
                    uVar34 = 0;
                    do {
                      if (*(char *)((long)puVar49 + uVar34) != *(char *)((long)puVar53 + uVar34)) {
                        puVar47 = (ulong *)((long)puVar49 + uVar34);
                        break;
                      }
                      uVar34 = uVar34 + 1;
                    } while (uVar46 != uVar34);
                  }
                  pHVar43 = (Hasher *)((long)puVar47 - (long)puVar1);
LAB_01158b0e:
                  uVar51 = (long)(pHVar43->common).extra + uVar51;
                  if (uVar51 < 0x80) {
                    uVar46 = (uVar28 & uVar35) * 2;
                    if (ringbuffer[uVar51 + (uVar28 & ringbuffer_mask)] <
                        ringbuffer[uVar51 + uVar27]) {
                      *(int *)((long)pvVar24 + uVar41 * 4) = (int)uVar28;
                      uVar46 = uVar46 | 1;
                      uVar41 = uVar46;
                      local_248 = uVar51;
                    }
                    else {
                      *(int *)((long)pvVar24 + uVar45 * 4) = (int)uVar28;
                      uVar45 = uVar46;
                      local_258 = uVar51;
                    }
                    uVar28 = (ulong)*(uint *)((long)pvVar24 + uVar46 * 4);
                    bVar59 = true;
                  }
                  else {
                    *(undefined4 *)((long)pvVar24 + uVar41 * 4) =
                         *(undefined4 *)((long)pvVar24 + (uVar28 & uVar35) * 8);
                    *(undefined4 *)((long)pvVar24 + uVar45 * 4) =
                         *(undefined4 *)((long)pvVar24 + (uVar28 & uVar35) * 8 + 4);
                    bVar59 = false;
                  }
                }
                lVar36 = lVar36 + -1;
              } while (bVar59);
              uVar39 = uVar39 + 8;
            } while (uVar39 < uVar23);
          }
          if (uVar23 < uVar22) {
            uVar35 = (hasher->privat)._H5.bucket_size_;
            puVar9 = (hasher->privat)._H2.buckets_;
            pvVar24 = (hasher->privat)._H40.extra[1];
            do {
              uVar41 = uVar23 & ringbuffer_mask;
              uVar19 = (uint)(*(int *)(ringbuffer + uVar41) * 0x1e35a7bd) >> 0xf;
              uVar27 = (ulong)puVar9[uVar19];
              uVar39 = (uVar35 & uVar23) * 2 + 1;
              uVar45 = (uVar35 & uVar23) * 2;
              puVar9[uVar19] = (uint32_t)uVar23;
              lVar36 = 0x40;
              local_250 = 0;
              local_248 = 0;
              do {
                if ((uVar23 == uVar27) || (lVar36 == 0 || uVar35 - 0xf < uVar23 - uVar27)) {
                  iVar20 = (hasher->privat)._H5.hash_shift_;
                  *(int *)((long)pvVar24 + uVar45 * 4) = iVar20;
                  *(int *)((long)pvVar24 + uVar39 * 4) = iVar20;
                  bVar59 = false;
                }
                else {
                  uVar28 = local_248;
                  if (local_250 < local_248) {
                    uVar28 = local_250;
                  }
                  puVar1 = (ulong *)(ringbuffer + uVar28 + uVar41);
                  puVar53 = (ulong *)(ringbuffer + uVar28 + (uVar27 & ringbuffer_mask));
                  puVar49 = puVar1;
                  uVar46 = uVar25;
                  for (uVar51 = 0x80 - uVar28; 7 < uVar51; uVar51 = uVar51 - 8) {
                    uVar34 = *puVar53;
                    uVar12 = *puVar49;
                    if (uVar34 == uVar12) {
                      puVar49 = puVar49 + 1;
                    }
                    else {
                      uVar46 = 0;
                      if ((uVar12 ^ uVar34) != 0) {
                        for (; ((uVar12 ^ uVar34) >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                        }
                      }
                      uVar46 = (long)puVar49 + ((uVar46 >> 3 & 0x1fffffff) - (long)puVar1);
                    }
                    if (uVar34 != uVar12) goto LAB_01158d1f;
                    puVar53 = puVar53 + 1;
                  }
                  puVar47 = puVar49;
                  if (uVar51 != 0) {
                    puVar47 = (ulong *)((long)puVar49 + uVar51);
                    uVar46 = 0;
                    do {
                      if (*(char *)((long)puVar49 + uVar46) != *(char *)((long)puVar53 + uVar46)) {
                        puVar47 = (ulong *)((long)puVar49 + uVar46);
                        break;
                      }
                      uVar46 = uVar46 + 1;
                    } while (uVar51 != uVar46);
                  }
                  uVar46 = (long)puVar47 - (long)puVar1;
LAB_01158d1f:
                  uVar46 = uVar46 + uVar28;
                  if (uVar46 < 0x80) {
                    uVar28 = (uVar27 & uVar35) * 2;
                    if (ringbuffer[uVar46 + (uVar27 & ringbuffer_mask)] <
                        ringbuffer[uVar46 + uVar41]) {
                      *(int *)((long)pvVar24 + uVar45 * 4) = (int)uVar27;
                      uVar28 = uVar28 | 1;
                      uVar45 = uVar28;
                      local_250 = uVar46;
                    }
                    else {
                      *(int *)((long)pvVar24 + uVar39 * 4) = (int)uVar27;
                      uVar39 = uVar28;
                      local_248 = uVar46;
                    }
                    uVar27 = (ulong)*(uint *)((long)pvVar24 + uVar28 * 4);
                    bVar59 = true;
                  }
                  else {
                    *(undefined4 *)((long)pvVar24 + uVar45 * 4) =
                         *(undefined4 *)((long)pvVar24 + (uVar27 & uVar35) * 8);
                    *(undefined4 *)((long)pvVar24 + uVar39 * 4) =
                         *(undefined4 *)((long)pvVar24 + (uVar27 & uVar35) * 8 + 4);
                    bVar59 = false;
                  }
                }
                lVar36 = lVar36 + -1;
              } while (bVar59);
              uVar23 = uVar23 + 1;
            } while (uVar23 < uVar22);
          }
          switchD_005700f1::default((void *)((long)local_1d8 + lVar29 * 4 + 4),0,(uVar25 - 1) * 4);
          lVar29 = lVar29 + (uVar25 - 1);
          auVar64 = _DAT_01352200;
          lVar36 = local_1d0 + 1;
        }
      }
      local_1d0 = lVar36;
      uVar35 = lVar29 + 4;
      lVar29 = lVar29 + 1;
    } while (uVar35 < num_bytes);
  }
  sVar8 = *num_literals;
  sVar10 = *last_insert_len;
  orig_dist_cache._0_8_ = *(undefined8 *)dist_cache;
  orig_dist_cache._8_8_ = *(undefined8 *)(dist_cache + 2);
  sVar40 = *num_commands;
  lVar58 = num_bytes + 1;
  if (lVar58 == 0) {
    nodes = (ZopfliNode *)0x0;
  }
  else {
    nodes = (ZopfliNode *)BrotliAllocate(m,lVar58 * 0x10);
  }
  InitZopfliCostModel(m,self,&params->dist,num_bytes);
  histogram = &self->field_6;
  puVar9 = (self->field_6).arena.histogram_cmd;
  histogram_00 = (self->field_6).arena.histogram_dist;
  cost = (self->field_6).arena.cost_literal;
  lVar29 = lVar58;
  paVar17 = &nodes->u;
  lVar36 = 0;
  do {
    for (; lVar29 != 0; lVar29 = lVar29 + -1) {
      ((ZopfliNode *)(paVar17 + -3))->length = 1;
      ((ZopfliNode *)(paVar17 + -3))->distance = 0;
      *(undefined8 *)(paVar17 + -1) = 0x7effc99e00000000;
      paVar17 = paVar17 + 4;
    }
    if (lVar36 == 0) {
      ZopfliCostModelSetFromLiteralCosts(self,position,ringbuffer,ringbuffer_mask);
    }
    else {
      sVar33 = *num_commands;
      switchD_005700f1::default(histogram,0,0x1780);
      if (sVar33 != sVar40) {
        lVar29 = 0;
        uVar30 = position - sVar10;
        do {
          uVar39 = (ulong)commands[lVar29].insert_len_;
          uVar19 = commands[lVar29].copy_len_;
          uVar6 = commands[lVar29].dist_prefix_;
          uVar7 = commands[lVar29].cmd_prefix_;
          puVar4 = puVar9 + uVar7;
          *puVar4 = *puVar4 + 1;
          uVar32 = uVar30;
          uVar35 = uVar39;
          if (0x7f < uVar7) {
            puVar4 = histogram_00 + (uVar6 & 0x3ff);
            *puVar4 = *puVar4 + 1;
          }
          for (; uVar35 != 0; uVar35 = uVar35 - 1) {
            piVar2 = (int *)((long)histogram + (ulong)ringbuffer[uVar32 & ringbuffer_mask] * 4);
            *piVar2 = *piVar2 + 1;
            uVar32 = uVar32 + 1;
          }
          uVar30 = uVar30 + uVar39 + (ulong)(uVar19 & 0x1ffffff);
          lVar29 = lVar29 + 1;
        } while (lVar29 != sVar33 - sVar40);
      }
      SetCost((uint32_t *)histogram->literal_histograms,0x100,1,cost);
      SetCost(puVar9,0x2c0,0,(float *)self);
      SetCost(histogram_00,(ulong)self->distance_histogram_size,0,self->cost_dist_);
      fVar60 = 1.7e+38;
      lVar29 = 0;
      do {
        if (self->cost_cmd_[lVar29] <= fVar60) {
          fVar60 = self->cost_cmd_[lVar29];
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 != 0x2c0);
      self->min_cost_cmd_ = fVar60;
      pfVar13 = self->literal_costs_;
      sVar33 = self->num_bytes_;
      *pfVar13 = 0.0;
      if (sVar33 != 0) {
        fVar60 = 0.0;
        sVar38 = 0;
        do {
          fVar60 = fVar60 + cost[ringbuffer[position + sVar38 & ringbuffer_mask]];
          pfVar3 = pfVar13 + sVar38;
          fVar63 = *pfVar3 + fVar60;
          pfVar13[sVar38 + 1] = fVar63;
          sVar38 = sVar38 + 1;
          fVar60 = fVar60 - (fVar63 - *pfVar3);
        } while (sVar33 != sVar38);
      }
    }
    *num_commands = sVar40;
    *num_literals = sVar8;
    *last_insert_len = sVar10;
    *(undefined8 *)dist_cache = orig_dist_cache._0_8_;
    *(undefined8 *)(dist_cache + 2) = orig_dist_cache._8_8_;
    iVar20 = params->lgwin;
    uVar19 = 0x145;
    if (params->quality < 0xb) {
      uVar19 = 0x96;
    }
    sVar33 = params->stream_offset;
    nodes->length = 0;
    (nodes->u).cost = 0.0;
    if (3 < num_bytes) {
      sVar55 = (1L << ((byte)iVar20 & 0x3f)) - 0x10;
      lVar29 = 0;
      sVar38 = 0;
      do {
        sVar31 = UpdateNodes(num_bytes,position,sVar38,ringbuffer,ringbuffer_mask,params,sVar55,
                             dist_cache,(ulong)*(uint *)((long)local_1d8 + sVar38 * 4),
                             (BackwardMatch *)((long)local_240 + lVar29 * 8),self,
                             (StartPosQueue *)dict_matches,nodes);
        uVar30 = 0;
        if (0x3fff < sVar31) {
          uVar30 = sVar31;
        }
        uVar32 = (ulong)*(uint *)((long)local_1d8 + sVar38 * 4);
        lVar29 = lVar29 + uVar32;
        if (((uVar32 == 1) &&
            (uVar21 = *(uint *)((long)local_240 + lVar29 * 8 + -4) >> 5, uVar19 < uVar21)) &&
           (uVar30 < uVar21)) {
          uVar30 = (ulong)uVar21;
        }
        if (1 < uVar30) {
          lVar26 = uVar30 - 1;
          uVar30 = sVar38 + 4;
          do {
            sVar38 = uVar30 - 3;
            if (num_bytes <= uVar30) break;
            EvaluateNode(sVar33 + position,sVar38,sVar55,gap,dist_cache,self,
                         (StartPosQueue *)dict_matches,nodes);
            lVar29 = lVar29 + (ulong)*(uint *)((long)local_1d8 + uVar30 * 4 + -0xc);
            uVar30 = uVar30 + 1;
            lVar26 = lVar26 + -1;
          } while (lVar26 != 0);
        }
        uVar30 = sVar38 + 4;
        sVar38 = sVar38 + 1;
      } while (uVar30 < num_bytes);
    }
    sVar33 = ComputeShortestPathFromNodes(num_bytes,nodes);
    *num_commands = *num_commands + sVar33;
    BrotliZopfliCreateCommands
              (num_bytes,position,nodes,dist_cache,last_insert_len,params,commands,num_literals);
    bVar59 = lVar36 != 0;
    lVar29 = lVar58;
    paVar17 = &nodes->u;
    lVar36 = lVar36 + 1;
    if (bVar59) {
      BrotliFree(m,self->literal_costs_);
      self->literal_costs_ = (float *)0x0;
      BrotliFree(m,self->cost_dist_);
      self->cost_dist_ = (float *)0x0;
      BrotliFree(m,self);
      BrotliFree(m,nodes);
      BrotliFree(m,local_240);
      BrotliFree(m,local_1d8);
      return;
    }
  } while( true );
}

Assistant:

void duckdb_brotli::BrotliCreateHqZopfliBackwardReferences(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  uint32_t* num_matches = BROTLI_ALLOC(m, uint32_t, num_bytes);
  size_t matches_size = 4 * num_bytes;
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t cur_match_pos = 0;
  size_t i;
  size_t orig_num_literals;
  size_t orig_last_insert_len;
  int orig_dist_cache[4];
  size_t orig_num_commands;
  ZopfliCostModel* model = BROTLI_ALLOC(m, ZopfliCostModel, 1);
  ZopfliNode* nodes;
  BackwardMatch* matches = BROTLI_ALLOC(m, BackwardMatch, matches_size);
  const CompoundDictionary* addon = &params->dictionary.compound;
  size_t gap = addon->total_size;
  size_t shadow_matches =
      (addon->num_chunks != 0) ? (MAX_NUM_MATCHES_H10 + 128) : 0;
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(model) ||
      BROTLI_IS_NULL(num_matches) || BROTLI_IS_NULL(matches)) {
    return;
  }
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; ++i) {
    const size_t pos = position + i;
    size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        pos + stream_offset, max_backward_limit);
    size_t max_length = num_bytes - i;
    size_t num_found_matches;
    size_t cur_match_end;
    size_t j;
    int dict_id = 0;
    if (params->dictionary.contextual.context_based) {
      uint8_t p1 = pos >= 1 ?
          ringbuffer[(size_t)(pos - 1) & ringbuffer_mask] : 0;
      uint8_t p2 = pos >= 2 ?
          ringbuffer[(size_t)(pos - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    /* Ensure that we have enough free slots. */
    BROTLI_ENSURE_CAPACITY(m, BackwardMatch, matches, matches_size,
        cur_match_pos + MAX_NUM_MATCHES_H10 + shadow_matches);
    if (BROTLI_IS_OOM(m)) return;
    num_found_matches = FindAllMatchesH10(&hasher->privat._H10,
        params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, pos, max_length,
        max_distance, dictionary_start + gap, params,
        &matches[cur_match_pos + shadow_matches]);
    if (addon->num_chunks != 0) {
      size_t cd_matches = LookupAllCompoundDictionaryMatches(addon,
          ringbuffer, ringbuffer_mask, pos, 3, max_length,
          dictionary_start, params->dist.max_distance,
          &matches[cur_match_pos + shadow_matches - 64], 64);
      MergeMatches(&matches[cur_match_pos],
          &matches[cur_match_pos + shadow_matches - 64], cd_matches,
          &matches[cur_match_pos + shadow_matches], num_found_matches);
      num_found_matches += cd_matches;
    }
    cur_match_end = cur_match_pos + num_found_matches;
    for (j = cur_match_pos; j + 1 < cur_match_end; ++j) {
      BROTLI_DCHECK(BackwardMatchLength(&matches[j]) <=
          BackwardMatchLength(&matches[j + 1]));
    }
    num_matches[i] = (uint32_t)num_found_matches;
    if (num_found_matches > 0) {
      const size_t match_len = BackwardMatchLength(&matches[cur_match_end - 1]);
      if (match_len > MAX_ZOPFLI_LEN_QUALITY_11) {
        const size_t skip = match_len - 1;
        matches[cur_match_pos++] = matches[cur_match_end - 1];
        num_matches[i] = 1;
        /* Add the tail of the copy to the hasher. */
        StoreRangeH10(&hasher->privat._H10,
                      ringbuffer, ringbuffer_mask, pos + 1,
                      BROTLI_MIN(size_t, pos + match_len, store_end));
        memset(&num_matches[i + 1], 0, skip * sizeof(num_matches[0]));
        i += skip;
      } else {
        cur_match_pos = cur_match_end;
      }
    }
  }
  orig_num_literals = *num_literals;
  orig_last_insert_len = *last_insert_len;
  memcpy(orig_dist_cache, dist_cache, 4 * sizeof(dist_cache[0]));
  orig_num_commands = *num_commands;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(nodes)) return;
  InitZopfliCostModel(m, model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < 2; i++) {
    BrotliInitZopfliNodes(nodes, num_bytes + 1);
    if (i == 0) {
      ZopfliCostModelSetFromLiteralCosts(
          model, position, ringbuffer, ringbuffer_mask);
    } else {
      ZopfliCostModelSetFromCommands(model, position, ringbuffer,
          ringbuffer_mask, commands, *num_commands - orig_num_commands,
          orig_last_insert_len);
    }
    *num_commands = orig_num_commands;
    *num_literals = orig_num_literals;
    *last_insert_len = orig_last_insert_len;
    memcpy(dist_cache, orig_dist_cache, 4 * sizeof(dist_cache[0]));
    *num_commands += ZopfliIterate(num_bytes, position, ringbuffer,
        ringbuffer_mask, params, gap, dist_cache, model, num_matches, matches,
        nodes);
    BrotliZopfliCreateCommands(num_bytes, position, nodes, dist_cache,
        last_insert_len, params, commands, num_literals);
  }
  CleanupZopfliCostModel(m, model);
  BROTLI_FREE(m, model);
  BROTLI_FREE(m, nodes);
  BROTLI_FREE(m, matches);
  BROTLI_FREE(m, num_matches);
}